

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void laguerre_1_set(int n,double *x,double *w)

{
  ostream *poVar1;
  double *w_local;
  double *x_local;
  int n_local;
  
  if (n == 1) {
    *x = 1.0;
    *w = 2.718281828459045;
  }
  else if (n == 2) {
    *x = 0.585786437626905;
    x[1] = 3.414213562373095;
    *w = 1.5333260331194167;
    w[1] = 4.450957335054593;
  }
  else if (n == 3) {
    *x = 0.4157745567834791;
    x[1] = 2.294280360279042;
    x[2] = 6.2899450829374794;
    *w = 1.0776928592709207;
    w[1] = 2.7621429619015876;
    w[2] = 5.601094625434427;
  }
  else if (n == 4) {
    *x = 0.3225476896193923;
    x[1] = 1.7457611011583465;
    x[2] = 4.536620296921128;
    x[3] = 9.395070912301133;
    *w = 0.8327391238378892;
    w[1] = 2.0481024384542965;
    w[2] = 3.6311463058215168;
    w[3] = 6.48714508440766;
  }
  else if (n == 5) {
    *x = 0.2635603197181409;
    x[1] = 1.4134030591065168;
    x[2] = 3.596425771040722;
    x[3] = 7.085810005858837;
    x[4] = 12.640800844275782;
    *w = 0.6790940422077504;
    w[1] = 1.638487873602747;
    w[2] = 2.7694432423708375;
    w[3] = 4.315656900920894;
    w[4] = 7.219186354354445;
  }
  else if (n == 6) {
    *x = 0.2228466041792607;
    x[1] = 1.188932101672623;
    x[2] = 2.992736326059314;
    x[3] = 5.77514356910451;
    x[4] = 9.83746741838259;
    x[5] = 15.982873980601703;
    *w = 0.5735355074227382;
    w[1] = 1.3692525907123045;
    w[2] = 2.2606845933826722;
    w[3] = 3.3505245823554555;
    w[4] = 4.886826800210821;
    w[5] = 7.849015945595828;
  }
  else if (n == 7) {
    *x = 0.19304367656036242;
    x[1] = 1.026664895339192;
    x[2] = 2.567876744950746;
    x[3] = 4.900353084526484;
    x[4] = 8.18215344456286;
    x[5] = 12.734180291797815;
    x[6] = 19.39572786226254;
    *w = 0.49647759753997234;
    w[1] = 1.1776430608611976;
    w[2] = 1.9182497816598063;
    w[3] = 2.7718486362321113;
    w[4] = 3.841249122488515;
    w[5] = 5.380678207921533;
    w[6] = 8.40543248682831;
  }
  else if (n == 8) {
    *x = 0.170279632305101;
    x[1] = 0.9037017767993799;
    x[2] = 2.2510866298661307;
    x[3] = 4.266700170287659;
    x[4] = 7.0459054023934655;
    x[5] = 10.758516010180996;
    x[6] = 15.740678641278004;
    x[7] = 22.863131736889265;
    *w = 0.43772341049291136;
    w[1] = 1.0338693476655976;
    w[2] = 1.6697097656587756;
    w[3] = 2.3769247017585995;
    w[4] = 3.208540913347926;
    w[5] = 4.268575510825134;
    w[6] = 5.818083368671918;
    w[7] = 8.906226215292222;
  }
  else if (n == 9) {
    *x = 0.15232222773180826;
    x[1] = 0.8072200227422558;
    x[2] = 2.0051351556193473;
    x[3] = 3.783473973331233;
    x[4] = 6.204956777876613;
    x[5] = 9.372985251687576;
    x[6] = 13.466236911092093;
    x[7] = 18.833597788991696;
    x[8] = 26.374071890927375;
    *w = 0.39143112431563987;
    w[1] = 0.9218050285289631;
    w[2] = 1.4801279099429154;
    w[3] = 2.0867708075492613;
    w[4] = 2.7729213897119713;
    w[5] = 3.5916260680922663;
    w[6] = 4.648766002140204;
    w[7] = 6.212275419747135;
    w[8] = 9.363218237705798;
  }
  else {
    if (n != 10) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"LAGUERRE_1_SET - Fatal error!\n");
      poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal value of N = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
      std::operator<<(poVar1,"\n");
      std::operator<<((ostream *)&std::cerr,"  Legal values are 1 to 10\n");
      exit(1);
    }
    *x = 0.13779347054049243;
    x[1] = 0.7294545495031705;
    x[2] = 1.808342901740316;
    x[3] = 3.4014336978548996;
    x[4] = 5.552496140063804;
    x[5] = 8.330152746764497;
    x[6] = 11.843785837900066;
    x[7] = 16.279257831378104;
    x[8] = 21.99658581198076;
    x[9] = 29.92069701227389;
    *w = 0.3540097386069963;
    w[1] = 0.8319023010435806;
    w[2] = 1.3302885617493283;
    w[3] = 1.863063903111131;
    w[4] = 2.4502555580830108;
    w[5] = 3.122764155135185;
    w[6] = 3.934152695561524;
    w[7] = 4.99241487219303;
    w[8] = 6.572202485130799;
    w[9] = 9.784695840374624;
  }
  return;
}

Assistant:

void laguerre_1_set ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    LAGUERRE_1_SET sets abscissas and weights for Laguerre quadrature.
//
//  Discussion:
//
//    This routine is specialized for the case where the density function is 1.
//
//    The integral:
//      I(f) = integral ( 0 <= x < +oo ) f(x) dx
//    The quadrature rule:
//      Q(f) = sum ( 1 <= i <= n ) w(i) * f ( x(i) )
//
//  Licensing:
//
//   This code is distributed under the GNU LGPL license.
// 
//  Modified:
//  
//    16 May 2014
//  
//  Author:
//  
//    John Burkardt
//  
//  Parameters:
//  
//    Input, int N, the order.
//    N must be between 1 and 10.
//  
//    Output, double X[N], the abscissas.
//  
//    Output, double W[N], the weights.
//
{
  if ( n == 1 )
  {
    x[0] =  1.00000000000000000000000000000E+00;

    w[0] =  2.7182818284590451;
  }
  else if ( n == 2 )
  {
    x[0] = 0.585786437626904951198311275790E+00;
    x[1] = 3.41421356237309504880168872421E+00;

    w[0] = 1.5333260331194167;
    w[1] = 4.4509573350545928;
  }
  else if ( n == 3 )
  {
    x[0] = 0.415774556783479083311533873128E+00;
    x[1] = 2.29428036027904171982205036136E+00;
    x[2] = 6.28994508293747919686641576551E+00;

    w[0] = 1.0776928592709207;
    w[1] = 2.7621429619015876;
    w[2] = 5.6010946254344267;
  }
  else if ( n == 4 )
  {
    x[0] = 0.322547689619392311800361459104E+00;
    x[1] = 1.74576110115834657568681671252E+00;
    x[2] = 4.53662029692112798327928538496E+00;
    x[3] = 9.39507091230113312923353644342E+00;

    w[0] = 0.83273912383788917;
    w[1] = 2.0481024384542965;
    w[2] = 3.6311463058215168;
    w[3] = 6.4871450844076604;
  }
  else if ( n == 5 )
  {
    x[0] = 0.263560319718140910203061943361E+00;
    x[1] = 1.41340305910651679221840798019E+00;
    x[2] = 3.59642577104072208122318658878E+00;
    x[3] = 7.08581000585883755692212418111E+00;
    x[4] = 12.6408008442757826594332193066E+00;

    w[0] = 0.67909404220775038;
    w[1] = 1.6384878736027471;
    w[2] = 2.7694432423708375;
    w[3] = 4.3156569009208940;
    w[4] = 7.2191863543544450;
  }
  else if ( n == 6 )
  {
    x[0] = 0.222846604179260689464354826787E+00;
    x[1] = 1.18893210167262303074315092194E+00;
    x[2] = 2.99273632605931407769132528451E+00;
    x[3] = 5.77514356910451050183983036943E+00;
    x[4] = 9.83746741838258991771554702994E+00;
    x[5] = 15.9828739806017017825457915674E+00;

    w[0] = 0.57353550742273818;
    w[1] = 1.3692525907123045;
    w[2] = 2.2606845933826722;
    w[3] = 3.3505245823554555;
    w[4] = 4.8868268002108213;
    w[5] = 7.8490159455958279;
  }
  else if ( n == 7 )
  {
    x[0] = 0.193043676560362413838247885004E+00;
    x[1] = 1.02666489533919195034519944317E+00;
    x[2] = 2.56787674495074620690778622666E+00;
    x[3] = 4.90035308452648456810171437810E+00;
    x[4] = 8.18215344456286079108182755123E+00;
    x[5] = 12.7341802917978137580126424582E+00;
    x[6] = 19.3957278622625403117125820576E+00;

    w[0] = 0.49647759753997234;
    w[1] = 1.1776430608611976;
    w[2] = 1.9182497816598063;
    w[3] = 2.7718486362321113;
    w[4] = 3.8412491224885148;
    w[5] = 5.3806782079215330;
    w[6] = 8.4054324868283103;
  }
  else if ( n == 8 )
  {
    x[0] = 0.170279632305100999788861856608E+00;
    x[1] = 0.903701776799379912186020223555E+00;
    x[2] = 2.25108662986613068930711836697E+00;
    x[3] = 4.26670017028765879364942182690E+00;
    x[4] = 7.04590540239346569727932548212E+00;
    x[5] = 10.7585160101809952240599567880E+00;
    x[6] = 15.7406786412780045780287611584E+00;
    x[7] = 22.8631317368892641057005342974E+00;

    w[0] = 0.43772341049291136;
    w[1] = 1.0338693476655976;
    w[2] = 1.6697097656587756;
    w[3] = 2.3769247017585995;
    w[4] = 3.2085409133479259;
    w[5] = 4.2685755108251344;
    w[6] = 5.8180833686719184;
    w[7] = 8.9062262152922216;
  }
  else if ( n == 9 )
  {
    x[0] = 0.152322227731808247428107073127E+00;
    x[1] = 0.807220022742255847741419210952E+00;
    x[2] = 2.00513515561934712298303324701E+00;
    x[3] = 3.78347397333123299167540609364E+00;
    x[4] = 6.20495677787661260697353521006E+00;
    x[5] = 9.37298525168757620180971073215E+00;
    x[6] = 13.4662369110920935710978818397E+00;
    x[7] = 18.8335977889916966141498992996E+00;
    x[8] = 26.3740718909273767961410072937E+00;

    w[0] = 0.39143112431563987;
    w[1] = 0.92180502852896307;
    w[2] = 1.4801279099429154;
    w[3] = 2.0867708075492613;
    w[4] = 2.7729213897119713;
    w[5] = 3.5916260680922663;
    w[6] = 4.6487660021402037;
    w[7] = 6.2122754197471348;
    w[8] = 9.3632182377057980;
  }
  else if ( n == 10 )
  {
    x[0] = 0.137793470540492430830772505653E+00;
    x[1] = 0.729454549503170498160373121676E+00;
    x[2] = 1.80834290174031604823292007575E+00;
    x[3] = 3.40143369785489951448253222141E+00;
    x[4] = 5.55249614006380363241755848687E+00;
    x[5] = 8.33015274676449670023876719727E+00;
    x[6] = 11.8437858379000655649185389191E+00;
    x[7] = 16.2792578313781020995326539358E+00;
    x[8] = 21.9965858119807619512770901956E+00;
    x[9] = 29.9206970122738915599087933408E+00;

    w[0] = 0.35400973860699630;
    w[1] = 0.83190230104358065;
    w[2] = 1.3302885617493283;
    w[3] = 1.8630639031111309;
    w[4] = 2.4502555580830108;
    w[5] = 3.1227641551351848;
    w[6] = 3.9341526955615240;
    w[7] = 4.9924148721930299;
    w[8] = 6.5722024851307994;
    w[9] = 9.7846958403746243;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "LAGUERRE_1_SET - Fatal error!\n";
    std::cerr << "  Illegal value of N = " << n << "\n";
    std::cerr << "  Legal values are 1 to 10\n";
    exit ( 1 );
  }
  return;
}